

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
sc_core::vcd_trace::compose_line(vcd_trace *this,string *data)

{
  char *originalbuf;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [55];
  allocator local_19 [25];
  
  pbVar1 = in_RDI;
  if (*(int *)(in_RSI + 0x4c) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else if (*(int *)(in_RSI + 0x4c) == 1) {
    std::operator+(in_RDI,in_RDI);
    pbVar1 = in_RDI;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"b",&local_91);
    originalbuf = (char *)std::__cxx11::string::c_str();
    strip_leading_bits(originalbuf);
    std::operator+(pbVar1,(char *)in_RDI);
    std::operator+(pbVar1,(char *)in_RDI);
    std::operator+(pbVar1,in_RDI);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return pbVar1;
}

Assistant:

std::string
vcd_trace::compose_line(const std::string& data)
{
  if(bit_width == 0)
    return "";
  if(bit_width == 1)
    return data + vcd_name;
  return std::string("b")+strip_leading_bits(data.c_str())+" "+vcd_name;
}